

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::quatf>
          (Attribute *this,double t,quatf *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::quatf> local_60;
  undefined1 local_4c [8];
  optional<tinyusdz::value::quatf> v;
  TimeSampleInterpolationType tinterp_local;
  quatf *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (quatf *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 8),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 8));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::quatf>(&local_60,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::quatf>::optional<tinyusdz::value::quatf,_0>
                ((optional<tinyusdz::value::quatf> *)local_4c,&local_60);
      nonstd::optional_lite::optional<tinyusdz::value::quatf>::~optional(&local_60);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4c);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::quatf>::value
                           ((optional<tinyusdz::value::quatf> *)local_4c);
        *(undefined8 *)(dst->imag)._M_elems = *(undefined8 *)(pvVar2->imag)._M_elems;
        *(undefined8 *)((dst->imag)._M_elems + 2) = *(undefined8 *)((pvVar2->imag)._M_elems + 2);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::quatf>::~optional
                ((optional<tinyusdz::value::quatf> *)local_4c);
      if (bVar1) goto LAB_002e3a70;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatf>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::quatf>(this,dst);
    }
  }
LAB_002e3a70:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }